

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::vector<unsigned_short>::resize(vector<unsigned_short> *this,uint32 new_size)

{
  bool bVar1;
  uint32 new_size_local;
  vector<unsigned_short> *this_local;
  
  if (this->m_size != new_size) {
    if (new_size < this->m_size) {
      scalar_type<unsigned_short>::destruct_array(this->m_p + new_size,this->m_size - new_size);
    }
    else {
      if ((this->m_capacity < new_size) &&
         (bVar1 = increase_capacity(this,new_size,new_size == this->m_size + 1), !bVar1)) {
        return false;
      }
      scalar_type<unsigned_short>::construct_array(this->m_p + this->m_size,new_size - this->m_size)
      ;
    }
    this->m_size = new_size;
  }
  return true;
}

Assistant:

inline bool resize(uint32 new_size)
        {
            if (m_size != new_size)
            {
                if (new_size < m_size)
                    scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
                else
                {
                    if (new_size > m_capacity)
                    {
                        if (!increase_capacity(new_size, new_size == (m_size + 1)))
                            return false;
                    }

                    scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
                }

                m_size = new_size;
            }

            return true;
        }